

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O0

int secp256r1_create_key_exchange
              (ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx)

{
  ptls_key_exchange_context_t *ppVar1;
  uECC_RNG_Function p_Var2;
  uECC_Curve curve;
  ptls_iovec_t pVar3;
  uint8_t *local_40;
  size_t local_38;
  st_secp256r1_key_exhchange_t *ctx;
  ptls_key_exchange_context_t **_ctx_local;
  ptls_key_exchange_algorithm_t *algo_local;
  
  ppVar1 = (ptls_key_exchange_context_t *)malloc(0x88);
  if (ppVar1 == (ptls_key_exchange_context_t *)0x0) {
    algo_local._4_4_ = 0x201;
  }
  else {
    pVar3 = ptls_iovec_init(ppVar1 + 2,0x41);
    ppVar1->algo = algo;
    local_40 = pVar3.base;
    (ppVar1->pubkey).base = local_40;
    local_38 = pVar3.len;
    (ppVar1->pubkey).len = local_38;
    ppVar1->on_exchange = secp256r1_on_exchange;
    *(undefined1 *)&ppVar1[2].algo = 4;
    p_Var2 = uECC_get_rng();
    if (p_Var2 == (uECC_RNG_Function)0x0) {
      __assert_fail("uECC_get_rng() != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/uecc.c",
                    0x5c,
                    "int secp256r1_create_key_exchange(ptls_key_exchange_algorithm_t *, ptls_key_exchange_context_t **)"
                   );
    }
    curve = uECC_secp256r1();
    uECC_make_key((uint8_t *)((long)&ppVar1[2].algo + 1),(uint8_t *)(ppVar1 + 1),curve);
    *_ctx = ppVar1;
    algo_local._4_4_ = 0;
  }
  return algo_local._4_4_;
}

Assistant:

static int secp256r1_create_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx)
{
    struct st_secp256r1_key_exhchange_t *ctx;

    if ((ctx = (struct st_secp256r1_key_exhchange_t *)malloc(sizeof(*ctx))) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ctx->super = (ptls_key_exchange_context_t){algo, ptls_iovec_init(ctx->pub, sizeof(ctx->pub)), secp256r1_on_exchange};
    ctx->pub[0] = TYPE_UNCOMPRESSED_PUBLIC_KEY;

    /* RNG function must be set before calling uECC_make_key() */
    assert(uECC_get_rng() != NULL);
    uECC_make_key(ctx->pub + 1, ctx->priv, uECC_secp256r1());

    *_ctx = &ctx->super;
    return 0;
}